

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  int a;
  undefined8 *puVar3;
  stbi__uint32 b;
  stbi__context *s;
  byte *pbVar4;
  stbi_uc sVar5;
  uint uVar6;
  stbi__uint32 sVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  char *pcVar11;
  stbi_uc *psVar12;
  void *pvVar13;
  stbi_uc *psVar14;
  byte bVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int why;
  ulong uVar16;
  int iVar17;
  stbi_uc **ppsVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  int *piVar22;
  int b_00;
  long lVar23;
  long in_FS_OFFSET;
  
  s = z->s;
  uVar6 = stbi__get16be(s);
  if (uVar6 < 0xb) {
LAB_0014b6aa:
    pcVar11 = "bad SOF len";
  }
  else {
    psVar12 = s->img_buffer;
    if (psVar12 < s->img_buffer_end) {
      s->img_buffer = psVar12 + 1;
      sVar5 = *psVar12;
LAB_0014b72b:
      if (sVar5 == '\b') {
        sVar7 = stbi__get16be(s);
        s->img_y = sVar7;
        if (sVar7 == 0) {
          pcVar11 = "no header height";
          goto LAB_0014bc86;
        }
        sVar7 = stbi__get16be(s);
        s->img_x = sVar7;
        if (sVar7 == 0) {
          pcVar11 = "0 width";
          goto LAB_0014bc86;
        }
        pbVar4 = s->img_buffer;
        psVar12 = s->img_buffer_end;
        if (pbVar4 < psVar12) {
          psVar14 = pbVar4 + 1;
          s->img_buffer = psVar14;
          bVar15 = *pbVar4;
LAB_0014b7e6:
          if (bVar15 < 5) {
            uVar20 = (ulong)bVar15;
            if ((0x1aU >> (bVar15 & 0x1f) & 1) != 0) {
              s->img_n = (uint)bVar15;
              ppsVar18 = &z->img_comp[0].data;
              uVar16 = uVar20;
              do {
                *ppsVar18 = (stbi_uc *)0x0;
                ppsVar18[3] = (stbi_uc *)0x0;
                ppsVar18 = ppsVar18 + 0xc;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
              if (uVar6 == (uint)bVar15 + (uint)bVar15 * 2 + 8) {
                z->rgb = 0;
                psVar1 = s->buffer_start;
                psVar2 = s->buffer_start + 1;
                piVar22 = &z->img_comp[0].tq;
                lVar23 = 0;
                do {
                  iVar10 = (int)uVar20;
                  if (psVar14 < psVar12) {
                    s->img_buffer = psVar14 + 1;
                    bVar15 = *psVar14;
                    psVar14 = psVar14 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar15 = 0;
                  }
                  else {
                    iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                    if (iVar10 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar15 = 0;
                      psVar12 = psVar2;
                    }
                    else {
                      bVar15 = *psVar1;
                      psVar12 = psVar1 + iVar10;
                    }
                    s->img_buffer_end = psVar12;
                    s->img_buffer = psVar2;
                    iVar10 = s->img_n;
                    psVar14 = psVar2;
                  }
                  ((anon_struct_96_18_0d0905d3 *)(piVar22 + -3))->id = (uint)bVar15;
                  if ((iVar10 == 3) && (bVar15 == "RGB"[lVar23])) {
                    z->rgb = z->rgb + 1;
                  }
                  if (psVar12 <= psVar14) {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar15 = 0;
                        psVar12 = psVar2;
                      }
                      else {
                        bVar15 = *psVar1;
                        psVar12 = psVar1 + iVar10;
                      }
                      s->img_buffer_end = psVar12;
                      s->img_buffer = psVar2;
                      psVar14 = psVar2;
                      goto LAB_0014b957;
                    }
                    piVar22[-2] = 0;
LAB_0014bc7f:
                    pcVar11 = "bad H";
                    goto LAB_0014bc86;
                  }
                  s->img_buffer = psVar14 + 1;
                  bVar15 = *psVar14;
                  psVar14 = psVar14 + 1;
LAB_0014b957:
                  piVar22[-2] = (uint)(bVar15 >> 4);
                  if ((byte)(bVar15 + 0xb0) < 0xc0) goto LAB_0014bc7f;
                  piVar22[-1] = bVar15 & 0xf;
                  if ((bVar15 & 0xf) - 5 < 0xfffffffc) {
                    pcVar11 = "bad V";
                    goto LAB_0014bc86;
                  }
                  if (psVar14 < psVar12) {
                    s->img_buffer = psVar14 + 1;
                    bVar15 = *psVar14;
                    psVar14 = psVar14 + 1;
LAB_0014b9f9:
                    *piVar22 = (uint)bVar15;
                    if (3 < bVar15) {
                      pcVar11 = "bad TQ";
                      goto LAB_0014bc86;
                    }
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
                      if (iVar10 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar15 = 0;
                        psVar12 = psVar2;
                      }
                      else {
                        bVar15 = *psVar1;
                        psVar12 = psVar1 + iVar10;
                      }
                      s->img_buffer_end = psVar12;
                      s->img_buffer = psVar2;
                      psVar14 = psVar2;
                      goto LAB_0014b9f9;
                    }
                    *piVar22 = 0;
                  }
                  lVar23 = lVar23 + 1;
                  iVar10 = s->img_n;
                  uVar20 = (ulong)iVar10;
                  piVar22 = piVar22 + 0x18;
                } while (lVar23 < (long)uVar20);
                if (scan != 0) {
                  return 1;
                }
                sVar7 = s->img_x;
                b = s->img_y;
                iVar8 = stbi__mad3sizes_valid(sVar7,b,iVar10,0);
                if (iVar8 == 0) {
                  *(char **)(in_FS_OFFSET + -0x10) = "too large";
                  return 0;
                }
                uVar6 = 1;
                uVar16 = 1;
                if (0 < iVar10) {
                  uVar16 = 1;
                  lVar23 = 0;
                  uVar6 = 1;
                  do {
                    uVar9 = *(uint *)((long)&z->img_comp[0].h + lVar23);
                    uVar19 = *(uint *)((long)&z->img_comp[0].v + lVar23);
                    if ((int)uVar6 < (int)uVar9) {
                      uVar6 = uVar9;
                    }
                    if ((int)uVar16 < (int)uVar19) {
                      uVar16 = (ulong)uVar19;
                    }
                    lVar23 = lVar23 + 0x60;
                  } while (uVar20 * 0x60 != lVar23);
                }
                iVar8 = (int)uVar16;
                uVar19 = ((sVar7 + uVar6 * 8) - 1) / (uVar6 * 8);
                uVar9 = ((b + iVar8 * 8) - 1) / (uint)(iVar8 * 8);
                z->img_h_max = uVar6;
                z->img_v_max = iVar8;
                z->img_mcu_w = uVar6 * 8;
                z->img_mcu_h = iVar8 * 8;
                z->img_mcu_x = uVar19;
                z->img_mcu_y = uVar9;
                if (iVar10 < 1) {
                  return 1;
                }
                iVar10 = 1;
                lVar23 = 0;
                while( true ) {
                  iVar17 = *(int *)((long)&z->img_comp[0].h + lVar23);
                  iVar21 = *(int *)((long)&z->img_comp[0].v + lVar23);
                  *(uint *)((long)&z->img_comp[0].x + lVar23) =
                       (iVar17 * sVar7 + (uVar6 - 1)) / uVar6;
                  *(int *)((long)&z->img_comp[0].y + lVar23) =
                       (int)((iVar21 * b + iVar8 + -1) / uVar16);
                  iVar17 = iVar17 * uVar19;
                  a = iVar17 * 8;
                  *(int *)((long)&z->img_comp[0].w2 + lVar23) = a;
                  iVar21 = iVar21 * uVar9;
                  b_00 = iVar21 * 8;
                  *(int *)((long)&z->img_comp[0].h2 + lVar23) = b_00;
                  pvVar13 = stbi__malloc_mad2(a,b_00,0xf);
                  puVar3 = (undefined8 *)((long)&z->img_comp[0].raw_coeff + lVar23);
                  *puVar3 = 0;
                  puVar3[1] = 0;
                  *(undefined8 *)((long)&z->img_comp[0].coeff + lVar23) = 0;
                  *(void **)((long)&z->img_comp[0].raw_data + lVar23) = pvVar13;
                  why = extraout_EDX;
                  if (pvVar13 == (void *)0x0) break;
                  *(ulong *)((long)&z->img_comp[0].data + lVar23) =
                       (long)pvVar13 + 0xfU & 0xfffffffffffffff0;
                  if (z->progressive != 0) {
                    *(int *)((long)&z->img_comp[0].coeff_w + lVar23) = iVar17;
                    *(int *)((long)&z->img_comp[0].coeff_h + lVar23) = iVar21;
                    pvVar13 = stbi__malloc_mad3(a,b_00,2,0xf);
                    *(void **)((long)&z->img_comp[0].raw_coeff + lVar23) = pvVar13;
                    why = extraout_EDX_00;
                    if (pvVar13 == (void *)0x0) break;
                    *(ulong *)((long)&z->img_comp[0].coeff + lVar23) =
                         (long)pvVar13 + 0xfU & 0xfffffffffffffff0;
                  }
                  iVar10 = iVar10 + 1;
                  lVar23 = lVar23 + 0x60;
                  if (uVar20 * 0x60 == lVar23) {
                    return 1;
                  }
                }
                *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                stbi__free_jpeg_components(z,iVar10,why);
                return 0;
              }
              goto LAB_0014b6aa;
            }
          }
        }
        else if (s->read_from_callbacks != 0) {
          psVar14 = s->buffer_start;
          iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar14,s->buflen);
          if (iVar10 == 0) {
            s->read_from_callbacks = 0;
            psVar12 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            bVar15 = 0;
          }
          else {
            psVar12 = psVar14 + iVar10;
            bVar15 = *psVar14;
          }
          s->img_buffer_end = psVar12;
          psVar14 = s->buffer_start + 1;
          s->img_buffer = psVar14;
          goto LAB_0014b7e6;
        }
        pcVar11 = "bad component count";
        goto LAB_0014bc86;
      }
    }
    else if (s->read_from_callbacks != 0) {
      psVar12 = s->buffer_start;
      iVar10 = (*(s->io).read)(s->io_user_data,(char *)psVar12,s->buflen);
      if (iVar10 == 0) {
        s->read_from_callbacks = 0;
        psVar14 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar5 = '\0';
      }
      else {
        psVar14 = psVar12 + iVar10;
        sVar5 = *psVar12;
      }
      s->img_buffer_end = psVar14;
      s->img_buffer = s->buffer_start + 1;
      goto LAB_0014b72b;
    }
    pcVar11 = "only 8-bit";
  }
LAB_0014bc86:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar11;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}